

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::UnknownModuleSymbol::fromSyntax
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               ASTContext *parentContext,SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  ParameterValueAssignmentSyntax *pPVar1;
  size_type sVar2;
  int iVar3;
  SyntaxNode *this;
  OrderedParamAssignmentSyntax *pOVar4;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  NamedParamAssignmentSyntax *pNVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Scope *pSVar7;
  NetType *netType;
  HierarchicalInstanceSyntax *instance;
  UnknownModuleSymbol *this_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *src;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  const_iterator __begin0;
  UnknownModuleSymbol *local_1d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_1d0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_1b8;
  string_view local_1a8;
  SmallVector<const_slang::ast::Expression_*,_5UL> params;
  ASTContext context;
  iterator __begin3;
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  local_58;
  
  params.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)params.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  params.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  params.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  ASTContext::resetFlags(&context,parentContext,(bitmask<slang::ast::ASTFlags>)0x80);
  pPVar1 = syntax->parameters;
  src = extraout_RDX;
  if (pPVar1 != (ParameterValueAssignmentSyntax *)0x0) {
    __begin3.index = 0;
    sVar2 = (pPVar1->parameters).elements.size_;
    __begin3.list = &pPVar1->parameters;
    for (; (__begin3.list != &pPVar1->parameters || (__begin3.index != sVar2 + 1 >> 1));
        __begin3.index = __begin3.index + 1) {
      this = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::
              iterator_base<slang::syntax::ParamAssignmentSyntax_*>::operator*(&__begin3)->
              super_SyntaxNode;
      if (this->kind == NamedParamAssignment) {
        pNVar6 = slang::syntax::SyntaxNode::as<slang::syntax::NamedParamAssignmentSyntax>(this);
        src = extraout_RDX_02;
        if (pNVar6->expr != (ExpressionSyntax *)0x0) {
          iVar3 = Expression::bind((int)pNVar6->expr,(sockaddr *)&context,4);
          local_1d0.first._M_len = CONCAT44(extraout_var_00,iVar3);
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)&params,
                     (Expression **)&local_1d0);
          src = extraout_RDX_03;
        }
      }
      else {
        src = extraout_RDX_00;
        if (this->kind == OrderedParamAssignment) {
          pOVar4 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(this);
          pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pOVar4->expr);
          iVar3 = Expression::bind((int)pEVar5,(sockaddr *)&context,0);
          local_1d0.first._M_len = CONCAT44(extraout_var,iVar3);
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)&params,
                     (Expression **)&local_1d0);
          src = extraout_RDX_01;
        }
      }
    }
  }
  iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (&params.super_SmallVectorBase<const_slang::ast::Expression_*>,
                     (EVP_PKEY_CTX *)compilation,src);
  local_1a8 = parsing::Token::valueText(&syntax->type);
  local_1b8.data_ = (pointer)CONCAT44(extraout_var_01,iVar3);
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  ::SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
              *)&__begin3);
  pSVar7 = not_null<const_slang::ast::Scope_*>::get(&context.scope);
  netType = Scope::getDefaultNetType(pSVar7);
  __begin0.index = 0;
  sVar2 = (syntax->instances).elements.size_;
  __begin0.list = &syntax->instances;
  for (; (__begin0.list != &syntax->instances || (__begin0.index != sVar2 + 1 >> 1));
      __begin0.index = __begin0.index + 1) {
    instance = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
               iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>::operator*
                         (&__begin0);
    anon_unknown.dwarf_383094::createImplicitNets
              (instance,&context,netType,
               (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
                *)&__begin3,implicitNets);
    anon_unknown.dwarf_383094::getNameLoc(&local_1d0,instance);
    this_00 = BumpAllocator::
              emplace<slang::ast::UnknownModuleSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::basic_string_view<char,std::char_traits<char>>&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                        (&compilation->super_BumpAllocator,&local_1d0.first,&local_1d0.second,
                         &local_1a8,&local_1b8);
    (this_00->super_Symbol).originatingSyntax = &instance->super_SyntaxNode;
    pSVar7 = not_null<const_slang::ast::Scope_*>::get(&context.scope);
    syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span
                          ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
    Symbol::setAttributes(&this_00->super_Symbol,pSVar7,syntax_00);
    local_1d8 = this_00;
    SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
              ((SmallVectorBase<slang::ast::Symbol_const*> *)results,(Symbol **)&local_1d8);
  }
  ska::detailv3::
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
  ::~sherwood_v3_table(&local_58);
  SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
            (&params.super_SmallVectorBase<const_slang::ast::Expression_*>);
  return;
}

Assistant:

void UnknownModuleSymbol::fromSyntax(Compilation& compilation,
                                     const HierarchyInstantiationSyntax& syntax,
                                     const ASTContext& parentContext,
                                     SmallVectorBase<const Symbol*>& results,
                                     SmallVectorBase<const Symbol*>& implicitNets) {
    SmallVector<const Expression*> params;
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);

    if (syntax.parameters) {
        for (auto expr : syntax.parameters->parameters) {
            // Empty expressions are just ignored here.
            if (expr->kind == SyntaxKind::OrderedParamAssignment)
                params.push_back(
                    &Expression::bind(*expr->as<OrderedParamAssignmentSyntax>().expr, context));
            else if (expr->kind == SyntaxKind::NamedParamAssignment) {
                if (auto ex = expr->as<NamedParamAssignmentSyntax>().expr)
                    params.push_back(&Expression::bind(*ex, context, ASTFlags::AllowDataType));
            }
        }
    }

    auto paramSpan = params.copy(compilation);
    createUnknownModules(compilation, syntax, syntax.type.valueText(), context, paramSpan, results,
                         implicitNets);
}